

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_name.c
# Opt level: O0

char * rndmonnam(void)

{
  int iVar1;
  bool bVar2;
  char *pcStack_10;
  int name;
  
  do {
    iVar1 = display_rng(0x271);
    bVar2 = false;
    if ((iVar1 < 0x158) && (bVar2 = true, (mons[iVar1].mflags2 & 0x80000) == 0)) {
      bVar2 = (mons[iVar1].geno & 0x200) != 0;
    }
  } while (bVar2);
  if (iVar1 < 0x158) {
    pcStack_10 = mons_mname(mons + iVar1);
  }
  else {
    pcStack_10 = bogusmons[iVar1 + -0x158];
  }
  return pcStack_10;
}

Assistant:

const char *rndmonnam(void)
{
	int name;

	do {
	    name = display_rng(SPECIAL_PM + SIZE(bogusmons) - LOW_PM) + LOW_PM;
	} while (name < SPECIAL_PM &&
	    (type_is_pname(&mons[name]) || (mons[name].geno & G_NOGEN)));

	if (name >= SPECIAL_PM) return bogusmons[name - SPECIAL_PM];
	return mons_mname(&mons[name]);
}